

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi_cache.cpp
# Opt level: O3

void __thiscall
icu_63::RuleBasedBreakIterator::BreakCache::reset(BreakCache *this,int32_t pos,int32_t ruleStatus)

{
  this->fStartBufIdx = 0;
  this->fEndBufIdx = 0;
  this->fTextIdx = pos;
  this->fBufIdx = 0;
  this->fBoundaries[0] = pos;
  this->fStatuses[0] = (uint16_t)ruleStatus;
  return;
}

Assistant:

void RuleBasedBreakIterator::BreakCache::reset(int32_t pos, int32_t ruleStatus) {
    fStartBufIdx = 0;
    fEndBufIdx = 0;
    fTextIdx = pos;
    fBufIdx = 0;
    fBoundaries[0] = pos;
    fStatuses[0] = (uint16_t)ruleStatus;
}